

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall
NetInterfaceSim::getString(NetInterfaceSim *this,WifiDebugOstream *log,string *input)

{
  int iVar1;
  fd_set readfds;
  timeval local_a8;
  fd_set local_90;
  
  local_90.fds_bits[0xd] = 0;
  local_90.fds_bits[0xe] = 0;
  local_90.fds_bits[0xb] = 0;
  local_90.fds_bits[0xc] = 0;
  local_90.fds_bits[9] = 0;
  local_90.fds_bits[10] = 0;
  local_90.fds_bits[7] = 0;
  local_90.fds_bits[8] = 0;
  local_90.fds_bits[5] = 0;
  local_90.fds_bits[6] = 0;
  local_90.fds_bits[3] = 0;
  local_90.fds_bits[4] = 0;
  local_90.fds_bits[1] = 0;
  local_90.fds_bits[2] = 0;
  local_90.fds_bits[0xf] = 0;
  local_a8.tv_sec = 0;
  local_a8.tv_usec = 0;
  local_90.fds_bits[0] = 1;
  iVar1 = select(1,&local_90,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
  if (iVar1 == 0) {
    std::__cxx11::string::_M_replace((ulong)input,0,(char *)input->_M_string_length,0x11239f);
  }
  else {
    std::operator>>((istream *)&std::cin,(string *)input);
  }
  return iVar1 != 0;
}

Assistant:

bool getString( WifiDebugOstream& log, std::string& input ) override
  {
    fd_set readfds;
    FD_ZERO(&readfds);

    struct timeval timeout;
    timeout.tv_sec = 0;
    timeout.tv_usec = 0;

    FD_SET(STDIN_FILENO, &readfds );
    if ( select(1, &readfds, nullptr, nullptr, &timeout ))
    {
      std::cin >> input;
      return true;
    }
    input = "";
    return false;
  }